

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::DEC_AB(CPU *this)

{
  uint16_t uVar1;
  uint uVar2;
  
  this->cycles = 6;
  uVar1 = GetWord(this);
  this->cycles = this->cycles - 1;
  uVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(uint)uVar1);
  this->cycles = this->cycles - 1;
  uVar2 = (uVar2 & 0xff) - 1;
  (*this->memory->_vptr_MemoryBus[3])(this->memory,(ulong)(uint)uVar1,(ulong)(uVar2 & 0xff));
  this->cycles = this->cycles - 1;
  (this->field_6).ps = (byte)uVar2 & 0x80 | ((short)uVar2 == 0) * '\x02' | (this->field_6).ps & 0x7d
  ;
  return;
}

Assistant:

void CPU::DEC_AB()
{
    cycles = 6;
    uint16_t addr = GetWord(), result = ReadByte(addr) - 1;
    cycles--;
    WriteByte(addr, result);
    Z = (result == 0);
    N = (result & 0b10000000) > 0;
}